

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condition.cpp
# Opt level: O0

int main(void)

{
  uint uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  Task *pTVar2;
  Executor *this_00;
  ostream *os;
  undefined1 *__stat_loc;
  Task D;
  Task C;
  Task B;
  Task A;
  int counter;
  Taskflow taskflow;
  Executor executor;
  string *in_stack_fffffffffffffc38;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffc40;
  Taskflow *this_01;
  string *in_stack_fffffffffffffc58;
  Taskflow *in_stack_fffffffffffffc60;
  allocator<char> *in_stack_fffffffffffffc70;
  Executor *this_02;
  allocator<char> *__s;
  FlowBuilder *this_03;
  __basic_future<void> local_370 [2];
  allocator<char> local_349;
  string local_348 [48];
  Task local_318;
  allocator<char> local_309;
  string local_308 [32];
  undefined1 *local_2e8;
  Task in_stack_fffffffffffffd28;
  size_t in_stack_fffffffffffffd30;
  Executor *in_stack_fffffffffffffd38;
  Task local_298;
  undefined1 local_289 [33];
  undefined1 *local_268;
  Task local_258;
  undefined1 local_250 [7];
  allocator<char> local_249;
  string local_248 [248];
  FlowBuilder local_150 [2];
  undefined1 local_140 [316];
  int local_4;
  
  local_4 = 0;
  uVar1 = std::thread::hardware_concurrency();
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar1;
  this_03 = local_150;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  tf::Executor::Executor
            (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
             (shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffd28._node);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x10489a);
  __s = &local_249;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,in_stack_fffffffffffffc70);
  tf::Taskflow::Taskflow(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator(&local_249);
  local_268 = local_250;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_condition_cpp:29:29),_nullptr>
            (this_03,(anon_class_8_1_bc7188dc *)this);
  this_02 = (Executor *)local_289;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)this_02);
  pTVar2 = tf::Task::name((Task *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  tf::Task::Task(&local_258,pTVar2);
  std::__cxx11::string::~string((string *)(local_289 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_289);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_condition_cpp:34:29),_nullptr>
            (this_03,(anon_class_8_1_bc7188dc *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)this_02);
  pTVar2 = tf::Task::name((Task *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  tf::Task::Task(&local_298,pTVar2);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd38);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd37);
  local_2e8 = local_250;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_condition_cpp:39:29),_nullptr>
            (this_03,(anon_class_8_1_bc7188dc *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)this_02);
  this_00 = (Executor *)tf::Task::name((Task *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  tf::Task::Task((Task *)&stack0xfffffffffffffd28,(Task *)this_00);
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator(&local_309);
  local_348._32_8_ = local_250;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_condition_cpp:49:29),_nullptr>
            (this_03,(anon_class_8_1_bc7188dc *)this);
  this_01 = (Taskflow *)&local_349;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)this_02);
  os = (ostream *)tf::Task::name((Task *)this_01,in_stack_fffffffffffffc38);
  tf::Task::Task(&local_318,(Task *)os);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator(&local_349);
  tf::Task::precede<tf::Task&>((Task *)this_01,(Task *)os);
  tf::Task::precede<tf::Task&>((Task *)this_01,(Task *)os);
  tf::Task::precede<tf::Task&>((Task *)this_01,(Task *)os);
  tf::Task::precede<tf::Task&>((Task *)this_01,(Task *)os);
  tf::Taskflow::dump(this_01,os);
  __stat_loc = local_140;
  tf::Executor::run(this_00,this_01);
  std::__basic_future<void>::wait(local_370,__stat_loc);
  tf::Future<void>::~Future((Future<void> *)this_01);
  local_4 = 0;
  tf::Taskflow::~Taskflow(this_01);
  tf::Executor::~Executor(this_02);
  return local_4;
}

Assistant:

int main() {

  tf::Executor executor;
  tf::Taskflow taskflow("Conditional Tasking Demo");

  int counter;

  auto A = taskflow.emplace([&](){
    std::cout << "initializes the counter to zero\n";
    counter = 0;
  }).name("A");

  auto B = taskflow.emplace([&](){
    std::cout << "loops to increment the counter\n";
    counter++;
  }).name("B");

  auto C = taskflow.emplace([&](){
    std::cout << "counter is " << counter << " -> ";
    if(counter != 5) {
      std::cout << "loops again (goes to B)\n";
      return 0;
    }
    std::cout << "breaks the loop (goes to D)\n";
    return 1;
  }).name("C");

  auto D = taskflow.emplace([&](){
    std::cout << "done with counter equal to " << counter << '\n';
  }).name("D");

  A.precede(B);
  B.precede(C);
  C.precede(B);
  C.precede(D);

  // visualizes the taskflow
  taskflow.dump(std::cout);

  // executes the taskflow
  executor.run(taskflow).wait();

  assert(counter == 5);

  return 0;
}